

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

UBool __thiscall icu_63::RegexMatcher::find(RegexMatcher *this,int64_t start,UErrorCode *status)

{
  UBool UVar1;
  int64_t nativeStart;
  UErrorCode *status_local;
  int64_t start_local;
  RegexMatcher *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    UVar1 = ::U_FAILURE(this->fDeferredStatus);
    if (UVar1 == '\0') {
      reset(this);
      if (start < 0) {
        *status = U_INDEX_OUTOFBOUNDS_ERROR;
        this_local._7_1_ = '\0';
      }
      else if ((start < this->fActiveStart) || (this->fActiveLimit < start)) {
        *status = U_INDEX_OUTOFBOUNDS_ERROR;
        this_local._7_1_ = '\0';
      }
      else {
        this->fMatchEnd = start;
        this_local._7_1_ = find(this,status);
      }
    }
    else {
      *status = this->fDeferredStatus;
      this_local._7_1_ = '\0';
    }
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool RegexMatcher::find(int64_t start, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return FALSE;
    }
    if (U_FAILURE(fDeferredStatus)) {
        status = fDeferredStatus;
        return FALSE;
    }
    this->reset();                        // Note:  Reset() is specified by Java Matcher documentation.
                                          //        This will reset the region to be the full input length.
    if (start < 0) {
        status = U_INDEX_OUTOFBOUNDS_ERROR;
        return FALSE;
    }

    int64_t nativeStart = start;
    if (nativeStart < fActiveStart || nativeStart > fActiveLimit) {
        status = U_INDEX_OUTOFBOUNDS_ERROR;
        return FALSE;
    }
    fMatchEnd = nativeStart;
    return find(status);
}